

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O1

int enum_ufs_prop(char *dir,char *name,char *ver,FINFO **finfo_buf)

{
  char *__s1;
  finfo *pfVar1;
  __mode_t _Var2;
  int iVar3;
  int *piVar4;
  DIR *__dirp;
  dirent *pdVar5;
  char *pcVar6;
  FINFO *pFVar7;
  FPROP *pFVar8;
  size_t sVar9;
  FINFO *pFVar10;
  char tver [16];
  stat sbuf;
  char pext [255];
  char pname [255];
  char text [255];
  char tname [255];
  char namebuf [4096];
  int local_1500;
  char local_14d8 [16];
  stat local_14c8;
  char local_1438 [256];
  char local_1338 [256];
  char local_1238 [256];
  char local_1138 [256];
  char local_1038 [4104];
  
  piVar4 = __errno_location();
  *piVar4 = 0;
  alarm(TIMEOUT_TIME);
  do {
    *piVar4 = 0;
    __dirp = opendir(dir);
    if (__dirp != (DIR *)0x0) {
      alarm(0);
      alarm(TIMEOUT_TIME);
      pdVar5 = readdir(__dirp);
      alarm(0);
      pFVar10 = (FINFO *)0x0;
      local_1500 = 0;
      goto LAB_00117b04;
    }
  } while (*piVar4 == 4);
  alarm(0);
  goto LAB_00117ab3;
LAB_00117b04:
  if (pdVar5 == (dirent *)0x0) {
    if (*piVar4 != 4) {
      closedir(__dirp);
      if (local_1500 < 1) {
        return local_1500;
      }
      *finfo_buf = pFVar10;
      return local_1500;
    }
  }
  else {
    __s1 = pdVar5->d_name;
    iVar3 = strcmp(__s1,".");
    if (((iVar3 != 0) && (iVar3 = strcmp(__s1,".."), iVar3 != 0)) && (pdVar5->d_ino != 0)) {
      strcpy(local_1138,__s1);
      strcpy(local_1338,name);
      separate_version(local_1138,local_14d8,0);
      pcVar6 = strrchr(local_1138,0x2e);
      if (pcVar6 == (char *)0x0) {
        local_1238[0] = '\0';
      }
      else {
        *pcVar6 = '\0';
        strcpy(local_1238,pcVar6 + 1);
      }
      pcVar6 = strrchr(local_1338,0x2e);
      if (pcVar6 == (char *)0x0) {
        local_1438[0] = '\0';
      }
      else {
        *pcVar6 = '\0';
        strcpy(local_1438,pcVar6 + 1);
      }
      iVar3 = match_pattern(local_1138,local_1338);
      if (((iVar3 != 0) && (iVar3 = match_pattern(local_1238,local_1438), iVar3 != 0)) &&
         (iVar3 = match_pattern(local_14d8,ver), iVar3 != 0)) {
        if (FreeFinfoList == (FINFO *)0x0) {
          pFVar7 = (FINFO *)calloc(1,0x228);
          if (pFVar7 != (FINFO *)0x0) {
            pFVar8 = (FPROP *)calloc(1,0x118);
            pFVar7->prop = pFVar8;
            if (pFVar8 != (FPROP *)0x0) goto LAB_00117cb2;
            free(pFVar7);
          }
          pFVar7 = (FINFO *)0x0;
        }
        else {
          pFVar7 = FreeFinfoList;
          FreeFinfoList = FreeFinfoList->next;
        }
LAB_00117cb2:
        pfVar1 = pFVar10;
        if (pFVar7 == (FINFO *)0x0) goto LAB_00117e50;
        pFVar7->next = pFVar10;
        sprintf(local_1038,"%s/%s",dir,__s1);
        alarm(TIMEOUT_TIME);
        do {
          *piVar4 = 0;
          iVar3 = stat(local_1038,&local_14c8);
          if (iVar3 != -1) {
            alarm(0);
            goto LAB_00117d24;
          }
        } while (*piVar4 == 4);
        alarm(0);
        pfVar1 = pFVar7;
        if (*piVar4 != 2) goto LAB_00117e79;
LAB_00117d24:
        strcpy(local_1038,__s1);
        _Var2 = local_14c8.st_mode;
        if ((local_14c8.st_mode & 0xf000) == 0x4000) {
          pFVar7->dirp = 1;
          quote_dname(local_1038);
          strcpy(pFVar7->lname,local_1038);
          sVar9 = strlen(local_1038);
          (pFVar7->lname + sVar9)[0] = '>';
          (pFVar7->lname + sVar9)[1] = '\0';
          sVar9 = sVar9 + 1;
        }
        else {
          pFVar7->dirp = 0;
          quote_fname_ufs(local_1038);
          sVar9 = strlen(local_1038);
          strcpy(pFVar7->lname,local_1038);
          pFVar7->lname[sVar9] = '\0';
        }
        pFVar7->lname_len = sVar9;
        strcpy(local_1038,__s1);
        pFVar7->ino = local_14c8.st_ino;
        pFVar7->prop->length = (uint)local_14c8.st_size;
        pFVar7->prop->wdate = (int)local_14c8.st_mtim.tv_sec + 0x1c94b00;
        pFVar7->prop->rdate = (int)local_14c8.st_atim.tv_sec + 0x1c94b00;
        pFVar7->prop->protect = _Var2;
        local_1500 = local_1500 + 1;
        pFVar10 = pFVar7;
      }
    }
  }
  *piVar4 = 0;
  alarm(TIMEOUT_TIME);
  pdVar5 = readdir(__dirp);
  alarm(0);
  goto LAB_00117b04;
LAB_00117e50:
  do {
    pFVar7 = pfVar1;
    pfVar1 = pFVar7->next;
  } while (pfVar1 != (finfo *)0x0);
  pFVar7->next = FreeFinfoList;
  FreeFinfoList = pFVar10;
  goto LAB_00117e9d;
LAB_00117e79:
  do {
    pFVar10 = pfVar1;
    pfVar1 = pFVar10->next;
  } while (pfVar1 != (finfo *)0x0);
  pFVar10->next = FreeFinfoList;
  FreeFinfoList = pFVar7;
LAB_00117e9d:
  closedir(__dirp);
LAB_00117ab3:
  *Lisp_errno = *piVar4;
  return -1;
}

Assistant:

static int enum_ufs_prop(char *dir, char *name, char *ver, FINFO **finfo_buf)
{
  struct dirent *dp;
  FINFO *prevp;
  FINFO *nextp;
  int n, rval;
  size_t len;
  DIR *dirp;
  /* struct passwd *pwd; -- From author support */
  struct stat sbuf;
  char namebuf[MAXPATHLEN];

  errno = 0;
  TIMEOUT0(dirp = opendir(dir));
  if (dirp == NULL) {
    *Lisp_errno = errno;
    return (-1);
  }

  for (S_TOUT(dp = readdir(dirp)), nextp = prevp = (FINFO *)NULL, n = 0;
       dp != (struct dirent *)NULL || errno == EINTR;
       errno = 0, S_TOUT(dp = readdir(dirp)), prevp = nextp)
    if (dp) {
      if (strcmp(dp->d_name, ".") == 0 || strcmp(dp->d_name, "..") == 0 || dp->d_ino == 0) continue;
      MatchP_Case((char *)dp->d_name, name, ver, match, unmatch);
    unmatch:
      continue;
    match:
      AllocFinfo(nextp);
      if (nextp == (FINFO *)NULL) {
        FreeFinfo(prevp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }
      nextp->next = prevp;
      sprintf(namebuf, "%s/%s", dir, dp->d_name);
      TIMEOUT(rval = stat(namebuf, &sbuf));
      if (rval == -1 && errno != ENOENT) {
        /*
         * ENOENT error might be caused by missing symbolic
         * link. We should ignore such error here.
         */
        FreeFinfo(nextp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }

      strcpy(namebuf, dp->d_name);
      if (S_ISDIR(sbuf.st_mode)) {
        nextp->dirp = 1;
        quote_dname(namebuf);
        strcpy(nextp->lname, namebuf);
        len = strlen(namebuf);
        *(nextp->lname + len) = DIRCHAR;
        *(nextp->lname + len + 1) = '\0';
        nextp->lname_len = len + 1;
      } else {
        /* All other types than directory. */
        nextp->dirp = 0;
        quote_fname_ufs(namebuf);
        len = strlen(namebuf);
        strcpy(nextp->lname, namebuf);
        *(nextp->lname + len) = '\0';
        nextp->lname_len = len;
      }

      strcpy(namebuf, dp->d_name);
      len = strlen(namebuf);
      nextp->ino = sbuf.st_ino;
      nextp->prop->length = (unsigned)sbuf.st_size;
      nextp->prop->wdate = (unsigned)ToLispTime(sbuf.st_mtime);
      nextp->prop->rdate = (unsigned)ToLispTime(sbuf.st_atime);
      nextp->prop->protect = (unsigned)sbuf.st_mode;
      /*
                      TIMEOUT(pwd = getpwuid(sbuf.st_uid));
                      if (pwd == (struct passwd *)NULL) {
                              nextp->prop->au_len = 0;
                      } else {
                              len = strlen(pwd->pw_name);
                              strcpy(nextp->prop->author, pwd->pw_name);
                              *(nextp->prop->author + len) = '\0';
                              nextp->prop->au_len = len;
                      }
      */
      n++;
    }
  closedir(dirp);
  if (n > 0) *finfo_buf = prevp;
  return (n);
}